

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_set_column.h
# Opt level: O1

void Gudhi::persistence_matrix::swap
               (Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
                *col1,Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
                      *col2)

{
  Dimension DVar1;
  ID_index IVar2;
  Index IVar3;
  Field_operators *pFVar4;
  Entry_constructor *pEVar5;
  
  DVar1 = (col1->super_Column_dimension_option).dim_;
  (col1->super_Column_dimension_option).dim_ = (col2->super_Column_dimension_option).dim_;
  (col2->super_Column_dimension_option).dim_ = DVar1;
  IVar2 = (col1->super_Chain_column_option).pivot_;
  (col1->super_Chain_column_option).pivot_ = (col2->super_Chain_column_option).pivot_;
  (col2->super_Chain_column_option).pivot_ = IVar2;
  IVar3 = (col1->super_Chain_column_option).pairedColumn_;
  (col1->super_Chain_column_option).pairedColumn_ = (col2->super_Chain_column_option).pairedColumn_;
  (col2->super_Chain_column_option).pairedColumn_ = IVar3;
  boost::intrusive::bstree_algorithms<boost::intrusive::rbtree_node_traits<void_*,_false>_>::
  swap_tree((node_ptr)&col1->column_,(node_ptr)&col2->column_);
  pFVar4 = col1->operators_;
  col1->operators_ = col2->operators_;
  col2->operators_ = pFVar4;
  pEVar5 = col1->entryPool_;
  col1->entryPool_ = col2->entryPool_;
  col2->entryPool_ = pEVar5;
  return;
}

Assistant:

void swap(Intrusive_set_column& col1, Intrusive_set_column& col2) {
    swap(static_cast<typename Master_matrix::Row_access_option&>(col1),
         static_cast<typename Master_matrix::Row_access_option&>(col2));
    swap(static_cast<typename Master_matrix::Column_dimension_option&>(col1),
         static_cast<typename Master_matrix::Column_dimension_option&>(col2));
    swap(static_cast<typename Master_matrix::Chain_column_option&>(col1),
         static_cast<typename Master_matrix::Chain_column_option&>(col2));
    col1.column_.swap(col2.column_);
    std::swap(col1.operators_, col2.operators_);
    std::swap(col1.entryPool_, col2.entryPool_);
  }